

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

size_t __thiscall
booster::locale::impl_icu::number_format<wchar_t>::do_parse<int>
          (number_format<wchar_t> *this,string_type *str,int *v)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int tmp_v;
  ParsePosition pp;
  UnicodeString tmp;
  Formattable val;
  int local_dc;
  code *local_d8;
  undefined8 local_d0;
  icu_std_converter<wchar_t,_4> local_c8 [16];
  Formattable local_88 [112];
  
  icu_70::Formattable::Formattable(local_88);
  local_d8 = std::_Rb_tree_increment;
  local_d0 = 0xffffffff00000000;
  icu_std_converter<wchar_t,_4>::icu
            (local_c8,(char_type_conflict *)&this->cvt_,(str->_M_dataplus)._M_p);
  (**(code **)(*(long *)this->icu_fmt_ + 0xa0))(this->icu_fmt_,local_c8,local_88,&local_d8);
  if ((int)local_d0 != 0) {
    bVar1 = get_value(this,&local_dc,local_88);
    if (bVar1) {
      iVar2 = icu_70::UnicodeString::countChar32((int)local_c8,0);
      if (iVar2 != 0) {
        sVar3 = (size_t)iVar2;
        *v = local_dc;
        goto LAB_001939e8;
      }
    }
  }
  sVar3 = 0;
LAB_001939e8:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_c8);
  icu_70::ParsePosition::~ParsePosition((ParsePosition *)&local_d8);
  icu_70::Formattable::~Formattable(local_88);
  return sVar3;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &v) const
            {
                icu::Formattable val;
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data()+str.size());

                icu_fmt_->parse(tmp,val,pp);

                ValueType tmp_v;

                if(pp.getIndex() == 0 || !get_value(tmp_v,val))
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                v=tmp_v;
                return cut;
            }